

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_srs(DisasContext_conflict1 *s,uint32_t mode,uint32_t amode,_Bool writeback)

{
  TCGContext_conflict1 *tcg_ctx_00;
  target_ulong tVar1;
  bool bVar2;
  uint32_t syn;
  int iVar3;
  TCGv_i32 retval;
  TCGv_i32 pTVar4;
  _Bool undef;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  int32_t offset;
  TCGContext_conflict1 *tcg_ctx;
  _Bool writeback_local;
  uint32_t amode_local;
  uint32_t mode_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  bVar2 = false;
  if (((s->current_el == 1) && ((s->ns & 1U) == 0)) && (mode == 0x16)) {
    tVar1 = s->pc_curr;
    syn = syn_uncategorized();
    gen_exception_insn(s,(uint32_t)tVar1,1,syn,3);
  }
  else {
    if ((s->current_el == 0) || (s->current_el == 2)) {
      bVar2 = true;
    }
    if (3 < mode - 0x10) {
      if (mode == 0x16) {
        if (s->current_el != 3) {
          bVar2 = true;
        }
      }
      else if (mode != 0x17) {
        if (mode == 0x1a) {
          if ((s->current_el == 1) || (iVar3 = arm_dc_feature(s,0x20), iVar3 == 0)) {
            bVar2 = true;
          }
        }
        else if ((mode != 0x1b) && (mode != 0x1f)) {
          bVar2 = true;
        }
      }
    }
    if (bVar2) {
      unallocated_encoding_aarch64(s);
    }
    else {
      retval = tcg_temp_new_i32(tcg_ctx_00);
      pTVar4 = tcg_const_i32_aarch64(tcg_ctx_00,mode);
      gen_set_condexec(s);
      gen_set_pc_im(s,s->pc_curr);
      gen_helper_get_r13_banked(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,pTVar4);
      tcg_temp_free_i32(tcg_ctx_00,pTVar4);
      switch(amode) {
      case 0:
        addr._4_4_ = -4;
        break;
      case 1:
        addr._4_4_ = 0;
        break;
      case 2:
        addr._4_4_ = -8;
        break;
      case 3:
        addr._4_4_ = 4;
        break;
      default:
        abort();
      }
      tcg_gen_addi_i32_aarch64(tcg_ctx_00,retval,retval,addr._4_4_);
      pTVar4 = load_reg(s,0xe);
      iVar3 = get_mem_index(s);
      gen_aa32_st32(s,pTVar4,retval,iVar3);
      tcg_temp_free_i32(tcg_ctx_00,pTVar4);
      pTVar4 = load_cpu_offset(tcg_ctx_00,0x158);
      tcg_gen_addi_i32_aarch64(tcg_ctx_00,retval,retval,4);
      iVar3 = get_mem_index(s);
      gen_aa32_st32(s,pTVar4,retval,iVar3);
      tcg_temp_free_i32(tcg_ctx_00,pTVar4);
      if (writeback) {
        switch(amode) {
        case 0:
          addr._4_4_ = -8;
          break;
        case 1:
          addr._4_4_ = 4;
          break;
        case 2:
          addr._4_4_ = -4;
          break;
        case 3:
          addr._4_4_ = 0;
          break;
        default:
          abort();
        }
        tcg_gen_addi_i32_aarch64(tcg_ctx_00,retval,retval,addr._4_4_);
        pTVar4 = tcg_const_i32_aarch64(tcg_ctx_00,mode);
        gen_helper_set_r13_banked(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar4,retval);
        tcg_temp_free_i32(tcg_ctx_00,pTVar4);
      }
      tcg_temp_free_i32(tcg_ctx_00,retval);
      (s->base).is_jmp = DISAS_TARGET_1;
    }
  }
  return;
}

Assistant:

static void gen_srs(DisasContext *s,
                    uint32_t mode, uint32_t amode, bool writeback)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int32_t offset;
    TCGv_i32 addr, tmp;
    bool undef = false;

    /* SRS is:
     * - trapped to EL3 if EL3 is AArch64 and we are at Secure EL1
     *   and specified mode is monitor mode
     * - UNDEFINED in Hyp mode
     * - UNPREDICTABLE in User or System mode
     * - UNPREDICTABLE if the specified mode is:
     * -- not implemented
     * -- not a valid mode number
     * -- a mode that's at a higher exception level
     * -- Monitor, if we are Non-secure
     * For the UNPREDICTABLE cases we choose to UNDEF.
     */
    if (s->current_el == 1 && !s->ns && mode == ARM_CPU_MODE_MON) {
        gen_exception_insn(s, s->pc_curr, EXCP_UDEF, syn_uncategorized(), 3);
        return;
    }

    if (s->current_el == 0 || s->current_el == 2) {
        undef = true;
    }

    switch (mode) {
    case ARM_CPU_MODE_USR:
    case ARM_CPU_MODE_FIQ:
    case ARM_CPU_MODE_IRQ:
    case ARM_CPU_MODE_SVC:
    case ARM_CPU_MODE_ABT:
    case ARM_CPU_MODE_UND:
    case ARM_CPU_MODE_SYS:
        break;
    case ARM_CPU_MODE_HYP:
        if (s->current_el == 1 || !arm_dc_feature(s, ARM_FEATURE_EL2)) {
            undef = true;
        }
        break;
    case ARM_CPU_MODE_MON:
        /* No need to check specifically for "are we non-secure" because
         * we've already made EL0 UNDEF and handled the trap for S-EL1;
         * so if this isn't EL3 then we must be non-secure.
         */
        if (s->current_el != 3) {
            undef = true;
        }
        break;
    default:
        undef = true;
    }

    if (undef) {
        unallocated_encoding(s);
        return;
    }

    addr = tcg_temp_new_i32(tcg_ctx);
    tmp = tcg_const_i32(tcg_ctx, mode);
    /* get_r13_banked() will raise an exception if called from System mode */
    gen_set_condexec(s);
    gen_set_pc_im(s, s->pc_curr);
    gen_helper_get_r13_banked(tcg_ctx, addr, tcg_ctx->cpu_env, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
    switch (amode) {
    case 0: /* DA */
        offset = -4;
        break;
    case 1: /* IA */
        offset = 0;
        break;
    case 2: /* DB */
        offset = -8;
        break;
    case 3: /* IB */
        offset = 4;
        break;
    default:
        abort();
    }
    tcg_gen_addi_i32(tcg_ctx, addr, addr, offset);
    tmp = load_reg(s, 14);
    gen_aa32_st32(s, tmp, addr, get_mem_index(s));
    tcg_temp_free_i32(tcg_ctx, tmp);
    tmp = load_cpu_field(tcg_ctx, spsr);
    tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);
    gen_aa32_st32(s, tmp, addr, get_mem_index(s));
    tcg_temp_free_i32(tcg_ctx, tmp);
    if (writeback) {
        switch (amode) {
        case 0:
            offset = -8;
            break;
        case 1:
            offset = 4;
            break;
        case 2:
            offset = -4;
            break;
        case 3:
            offset = 0;
            break;
        default:
            abort();
        }
        tcg_gen_addi_i32(tcg_ctx, addr, addr, offset);
        tmp = tcg_const_i32(tcg_ctx, mode);
        gen_helper_set_r13_banked(tcg_ctx, tcg_ctx->cpu_env, tmp, addr);
        tcg_temp_free_i32(tcg_ctx, tmp);
    }
    tcg_temp_free_i32(tcg_ctx, addr);
    s->base.is_jmp = DISAS_UPDATE;
}